

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddCas.c
# Opt level: O2

int Extra_bddNodePathsUnderCutArray
              (DdManager *dd,DdNode **paNodes,DdNode **pbCubes,int nNodes,DdNode **paNodesRes,
              DdNode **pbCubesRes,int CutLevel)

{
  DdNode **ppDVar1;
  DdNode **ppDVar2;
  int iVar3;
  st__table *table;
  st__generator *psVar4;
  long lVar5;
  DdNode *pDVar6;
  ulong uVar7;
  traventry *p;
  st__table *local_50;
  DdNode *aNode;
  DdNode **local_40;
  DdNode **local_38;
  
  s_CutLevel = CutLevel;
  if (0 < nNodes) {
    if ((nNodes == 1) && (*(int *)((ulong)*paNodes & 0xfffffffffffffffe) == 0x7fffffff)) {
      if (*paNodes == dd->one) {
        *paNodesRes = dd->one;
        pDVar6 = dd->one;
      }
      else {
        pDVar6 = dd->zero;
        *paNodesRes = pDVar6;
      }
      Cudd_Ref(pDVar6);
      pDVar6 = *pbCubes;
      *pbCubesRes = pDVar6;
      Cudd_Ref(pDVar6);
      lVar5 = 1;
    }
    else {
      local_40 = paNodesRes;
      local_38 = pbCubesRes;
      local_50 = st__init_table(st__ptrcmp,st__ptrhash);
      table = st__init_table(st__ptrcmp,st__ptrhash);
      for (uVar7 = 0; (uint)nNodes != uVar7; uVar7 = uVar7 + 1) {
        CountNodeVisits_rec(dd,paNodes[uVar7],table);
      }
      for (uVar7 = 0; (uint)nNodes != uVar7; uVar7 = uVar7 + 1) {
        CollectNodesAndComputePaths_rec(dd,paNodes[uVar7],pbCubes[uVar7],table,local_50);
      }
      psVar4 = st__init_gen(table);
      ppDVar2 = local_38;
      while( true ) {
        iVar3 = st__gen(psVar4,(char **)&aNode,(char **)&p);
        if (iVar3 == 0) break;
        Cudd_RecursiveDeref(dd,p->bSum);
        if (p != (traventry *)0x0) {
          free(p);
          p = (traventry *)0x0;
        }
      }
      st__free_gen(psVar4);
      st__free_table(table);
      psVar4 = st__init_gen(local_50);
      ppDVar1 = local_40;
      lVar5 = 0;
      while( true ) {
        iVar3 = st__gen(psVar4,(char **)&aNode,(char **)&p);
        if (iVar3 == 0) break;
        ppDVar1[lVar5] = aNode;
        Cudd_Ref(aNode);
        ppDVar2[lVar5] = (DdNode *)p;
        lVar5 = lVar5 + 1;
      }
      st__free_gen(psVar4);
      st__free_table(local_50);
    }
    return (int)lVar5;
  }
  __assert_fail("nNodes > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/extrab/extraBddCas.c"
                ,0x16c,
                "int Extra_bddNodePathsUnderCutArray(DdManager *, DdNode **, DdNode **, int, DdNode **, DdNode **, int)"
               );
}

Assistant:

int Extra_bddNodePathsUnderCutArray( DdManager * dd, DdNode ** paNodes, DdNode ** pbCubes, int nNodes, DdNode ** paNodesRes, DdNode ** pbCubesRes, int CutLevel )
{
    st__table * Visited;  // temporary table to remember the visited nodes
    st__table * CutNodes; // the nodes under the cut go here
    int i, Counter;

    s_CutLevel = CutLevel;

    // there should be some nodes
    assert( nNodes > 0 );
    if ( nNodes == 1 && Cudd_IsConstant( paNodes[0] ) )
    {
        if ( paNodes[0] == a1 )
        {
            paNodesRes[0] = a1;          Cudd_Ref( a1 );
            pbCubesRes[0] = pbCubes[0];  Cudd_Ref( pbCubes[0] );
        }
        else
        {
            paNodesRes[0] = a0;          Cudd_Ref( a0 );
            pbCubesRes[0] = pbCubes[0];  Cudd_Ref( pbCubes[0] );
        }
        return 1;
    }

    // Step 1: Start the table and collect information about the nodes above the cut 
    // this information tells how many edges point to each node
    CutNodes = st__init_table( st__ptrcmp, st__ptrhash);;
    Visited  = st__init_table( st__ptrcmp, st__ptrhash);;

    for ( i = 0; i < nNodes; i++ )
        CountNodeVisits_rec( dd, paNodes[i], Visited );

    // Step 2: Traverse the BDD using the visited table and compute the sum of paths
    for ( i = 0; i < nNodes; i++ )
        CollectNodesAndComputePaths_rec( dd, paNodes[i], pbCubes[i], Visited, CutNodes );

    // at this point, the table of cut nodes is ready and the table of visited is useless
    {
        st__generator * gen;
        DdNode * aNode;
        traventry * p;
        st__foreach_item( Visited, gen, (const char**)&aNode, (char**)&p )
        {
            Cudd_RecursiveDeref( dd, p->bSum );
            ABC_FREE( p );
        }
        st__free_table( Visited );
    }

    // go through the table CutNodes and create the BDD and the path to be returned
    {
        st__generator * gen;
        DdNode * aNode, * bSum;
        Counter = 0;
        st__foreach_item( CutNodes, gen, (const char**)&aNode, (char**)&bSum)
        {
            paNodesRes[Counter] = aNode;   Cudd_Ref( aNode ); 
            pbCubesRes[Counter] = bSum;
            Counter++;
        }
        st__free_table( CutNodes );
    }

    // return the number of cofactors found
    return Counter;

}